

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::writeMPS
          (SPxLPBase<double> *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars,bool writeZeroObjective)

{
  Item *pIVar1;
  double dVar2;
  Nonzero<double> *pNVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  SPxOut *pSVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  char *pcVar9;
  undefined8 *puVar10;
  char *pcVar11;
  char *name2_00;
  bool bVar12;
  uint uVar13;
  byte bVar14;
  bool bVar15;
  int iVar16;
  bool bVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  long in_FS_OFFSET;
  Real RVar22;
  double dVar23;
  double dVar24;
  char name1 [16];
  char name [16];
  Verbosity old_verbosity;
  char name2 [16];
  double local_108;
  long local_d8;
  char local_98 [16];
  char local_88 [16];
  ulong local_78;
  undefined4 local_6c;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  char local_48 [24];
  
  lVar20 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar20 + -0x18) + 8) = 0x10;
  lVar20 = *(long *)(lVar20 + -0x18);
  *(uint *)(p_output + lVar20 + 0x18) = *(uint *)(p_output + lVar20 + 0x18) & 0xfffffefb | 0x100;
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"NAME          MPSDATA",0x15);
  cVar6 = (char)p_output;
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"ROWS",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
    bVar12 = false;
  }
  else {
    dVar23 = *(double *)(in_FS_OFFSET + -8);
    lVar20 = 0;
    bVar17 = false;
    do {
      dVar24 = (this->super_LPRowSetBase<double>).left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar20];
      dVar2 = (this->super_LPRowSetBase<double>).right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar20];
      if ((dVar24 != dVar2) || (NAN(dVar24) || NAN(dVar2))) {
        ::soplex::infinity::__tls_init();
        if (-dVar23 < dVar24) {
          dVar24 = (this->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar20];
          ::soplex::infinity::__tls_init();
          pcVar11 = "E";
          bVar12 = true;
          if (dVar24 < dVar23) goto LAB_001b0dc4;
        }
        dVar24 = (this->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar20];
        ::soplex::infinity::__tls_init();
        if (-dVar23 < dVar24) {
          pcVar11 = "G";
          bVar12 = bVar17;
        }
        else {
          dVar24 = (this->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar20];
          ::soplex::infinity::__tls_init();
          pcVar11 = "L";
          bVar12 = bVar17;
          if (dVar23 <= dVar24) {
            puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_68 = local_58;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,"XMPSWR02 This should never happen.","");
            *puVar10 = &PTR__SPxException_0069d438;
            puVar10[1] = puVar10 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar10 + 1),local_68,local_68 + local_60);
            *puVar10 = &PTR__SPxException_0069d410;
            __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
        }
      }
      else {
        pcVar11 = "E";
        bVar12 = bVar17;
      }
LAB_001b0dc4:
      pcVar9 = MPSgetRowName<double>
                         ((SPxLPBase<double> *)
                          (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey,
                          (int)lVar20,p_rnames,local_88);
      MPSwriteRecord<double>(p_output,pcVar11,pcVar9,(char *)0x0,0.0,(char *)0x0,0.0);
      lVar20 = lVar20 + 1;
      bVar17 = bVar12;
    } while (lVar20 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  bVar17 = false;
  MPSwriteRecord<double>(p_output,"N","MINIMIZE",(char *)0x0,0.0,(char *)0x0,0.0);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"COLUMNS",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  if (p_intvars != (DIdxSet *)0x0) {
    bVar17 = 0 < (p_intvars->super_IdxSet).num;
  }
  bVar7 = 1;
  bVar14 = 0;
  do {
    bVar15 = (bool)(bVar14 & bVar17);
    if (bVar15 == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                (p_output,"    MARK0001  \'MARKER\'                 \'INTORG\'",0x2f);
      std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    if (0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
      local_d8 = 0;
      do {
        iVar19 = (int)local_d8;
        if ((bVar17 == false) ||
           (iVar8 = IdxSet::pos(&p_intvars->super_IdxSet,iVar19), -1 < iVar8 == bVar15)) {
          pIVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                   (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[local_d8].
                   idx;
          uVar21 = (pIVar1->data).super_SVectorBase<double>.memused;
          uVar13 = uVar21 - ((int)uVar21 >> 0x1f) & 0xfffffffe;
          if ((int)uVar21 < 2) {
            uVar18 = 0;
          }
          else {
            local_78 = (ulong)uVar13;
            lVar20 = 0;
            uVar18 = 0;
            do {
              pcVar11 = getColName<double>((SPxLPBase<double> *)
                                           (this->super_LPColSetBase<double>).
                                           super_SVSetBase<double>.set.thekey,iVar19,p_cnames,
                                           local_88);
              pcVar9 = MPSgetRowName<double>
                                 ((SPxLPBase<double> *)
                                  (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                  thekey,*(int *)((long)&((pIVar1->data).super_SVectorBase<double>.
                                                         m_elem)->idx + lVar20),p_rnames,local_98);
              pNVar3 = (pIVar1->data).super_SVectorBase<double>.m_elem;
              dVar23 = *(double *)((long)&pNVar3->val + lVar20);
              name2_00 = MPSgetRowName<double>
                                   ((SPxLPBase<double> *)
                                    (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                    thekey,*(int *)((long)&pNVar3[1].idx + lVar20),p_rnames,local_48
                                   );
              MPSwriteRecord<double>
                        (p_output,(char *)0x0,pcVar11,pcVar9,dVar23,name2_00,
                         *(double *)
                          ((long)&(pIVar1->data).super_SVectorBase<double>.m_elem[1].val + lVar20));
              uVar18 = uVar18 + 2;
              lVar20 = lVar20 + 0x20;
            } while (uVar18 < local_78);
            uVar21 = (pIVar1->data).super_SVectorBase<double>.memused;
          }
          if (uVar13 != uVar21) {
            pcVar11 = getColName<double>((SPxLPBase<double> *)
                                         (this->super_LPColSetBase<double>).super_SVSetBase<double>.
                                         set.thekey,iVar19,p_cnames,local_88);
            pcVar9 = MPSgetRowName<double>
                               ((SPxLPBase<double> *)
                                (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thekey,(pIVar1->data).super_SVectorBase<double>.m_elem[uVar18].idx,
                                p_rnames,local_98);
            MPSwriteRecord<double>
                      (p_output,(char *)0x0,pcVar11,pcVar9,
                       (pIVar1->data).super_SVectorBase<double>.m_elem[uVar18].val,(char *)0x0,0.0);
          }
          this_00 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          dVar23 = (this->super_LPColSetBase<double>).object.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[local_d8];
          this_01 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          RVar22 = Tolerances::epsilon(this_00);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          if (RVar22 < ABS(dVar23) || writeZeroObjective) {
            pcVar11 = getColName<double>((SPxLPBase<double> *)
                                         (this->super_LPColSetBase<double>).super_SVSetBase<double>.
                                         set.thekey,iVar19,p_cnames,local_88);
            MPSwriteRecord<double>
                      (p_output,(char *)0x0,pcVar11,"MINIMIZE",
                       -(this->super_LPColSetBase<double>).object.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[local_d8],(char *)0x0,0.0);
          }
        }
        local_d8 = local_d8 + 1;
      } while (local_d8 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    }
    if (bVar15 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (p_output,"    MARK0001  \'MARKER\'                 \'INTEND\'",0x2f);
      std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      break;
    }
    bVar14 = 1;
    bVar5 = bVar7 & bVar17;
    bVar7 = 0;
  } while (bVar5 != 0);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"RHS",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  iVar19 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (0 < iVar19) {
    uVar18 = 0;
    do {
      if ((int)uVar18 < iVar19) {
        uVar18 = (ulong)(int)uVar18;
        do {
          dVar23 = MPSgetRHS<double>((this->super_LPRowSetBase<double>).left.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar18],
                                     (this->super_LPRowSetBase<double>).right.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar18]);
          iVar19 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
          if ((dVar23 != 0.0) || (NAN(dVar23))) break;
          uVar18 = uVar18 + 1;
        } while ((long)uVar18 < (long)iVar19);
      }
      else {
        dVar23 = 0.0;
      }
      iVar8 = (int)uVar18;
      if (iVar8 < iVar19) {
        uVar21 = iVar8 + 1;
        dVar24 = 0.0;
        iVar16 = iVar8;
        if ((int)uVar21 < iVar19) {
          lVar20 = (long)iVar8;
          uVar18 = lVar20 + 1;
          uVar21 = (uint)uVar18;
          dVar24 = MPSgetRHS<double>((this->super_LPRowSetBase<double>).left.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar20 + 1],
                                     (this->super_LPRowSetBase<double>).right.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar20 + 1]);
          iVar19 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
          if ((dVar24 == 0.0) && (!NAN(dVar24))) {
            lVar20 = lVar20 + 2;
            while (iVar16 = (int)uVar18, lVar20 < iVar19) {
              dVar24 = MPSgetRHS<double>((this->super_LPRowSetBase<double>).left.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[lVar20],
                                         (this->super_LPRowSetBase<double>).right.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[lVar20]);
              uVar21 = iVar16 + 1;
              uVar18 = (ulong)uVar21;
              lVar20 = lVar20 + 1;
              iVar19 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
              if ((dVar24 != 0.0) || (NAN(dVar24))) goto LAB_001b152c;
            }
            uVar21 = iVar16 + 1;
          }
        }
LAB_001b152c:
        pcVar11 = MPSgetRowName<double>
                            ((SPxLPBase<double> *)
                             (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey,
                             iVar8,p_rnames,local_98);
        if ((int)uVar21 < iVar19) {
          pcVar9 = MPSgetRowName<double>
                             ((SPxLPBase<double> *)
                              (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey,
                              uVar21,p_rnames,local_48);
        }
        else {
          dVar24 = 0.0;
          pcVar9 = (char *)0x0;
        }
        MPSwriteRecord<double>(p_output,(char *)0x0,"RHS",pcVar11,dVar23,pcVar9,dVar24);
        iVar19 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        uVar18 = (ulong)(iVar16 + 2);
      }
    } while ((int)uVar18 < iVar19);
  }
  if (bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>(p_output,"RANGES",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    if (0 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
      dVar23 = *(double *)(in_FS_OFFSET + -8);
      lVar20 = 0;
      do {
        dVar24 = (this->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar20];
        ::soplex::infinity::__tls_init();
        if ((-dVar23 < dVar24) &&
           (dVar24 = (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar20], ::soplex::infinity::__tls_init(),
           dVar24 < dVar23)) {
          pcVar11 = MPSgetRowName<double>
                              ((SPxLPBase<double> *)
                               (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                               ,(int)lVar20,p_rnames,local_98);
          MPSwriteRecord<double>
                    (p_output,"","RANGE",pcVar11,
                     (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar20] -
                     (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar20],(char *)0x0,0.0);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"BOUNDS",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  if (0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    dVar23 = *(double *)(in_FS_OFFSET + -8);
    lVar20 = 0;
    do {
      dVar24 = (this->super_LPColSetBase<double>).low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar20];
      dVar2 = (this->super_LPColSetBase<double>).up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar20];
      iVar19 = (int)lVar20;
      if ((dVar24 != dVar2) || (NAN(dVar24) || NAN(dVar2))) {
        ::soplex::infinity::__tls_init();
        if (dVar24 <= -dVar23) {
          dVar24 = (this->super_LPColSetBase<double>).up.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar20];
          ::soplex::infinity::__tls_init();
          if (dVar24 < dVar23) {
            local_108 = (this->super_LPColSetBase<double>).low.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar20];
            if (local_108 == 0.0) goto joined_r0x001b18ef;
            goto LAB_001b18fa;
          }
          pcVar11 = getColName<double>((SPxLPBase<double> *)
                                       (this->super_LPColSetBase<double>).super_SVSetBase<double>.
                                       set.thekey,iVar19,p_cnames,local_98);
          dVar24 = 0.0;
          pcVar9 = "FR";
          goto LAB_001b1a1f;
        }
        local_108 = (this->super_LPColSetBase<double>).low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar20];
        if (local_108 == 0.0) {
joined_r0x001b18ef:
          if (NAN(local_108)) goto LAB_001b18fa;
        }
        else {
LAB_001b18fa:
          ::soplex::infinity::__tls_init();
          pcVar11 = getColName<double>((SPxLPBase<double> *)
                                       (this->super_LPColSetBase<double>).super_SVSetBase<double>.
                                       set.thekey,iVar19,p_cnames,local_98);
          if (local_108 <= -dVar23) {
            dVar24 = 0.0;
            pcVar9 = "MI";
          }
          else {
            dVar24 = (this->super_LPColSetBase<double>).low.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar20];
            pcVar9 = "LO";
          }
          MPSwriteRecord<double>(p_output,pcVar9,"BOUND",pcVar11,dVar24,(char *)0x0,0.0);
        }
        if (((bVar17 != false) && (iVar8 = IdxSet::pos(&p_intvars->super_IdxSet,iVar19), -1 < iVar8)
            ) || (dVar24 = (this->super_LPColSetBase<double>).up.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar20],
                 ::soplex::infinity::__tls_init(), dVar24 < dVar23)) {
          pcVar11 = getColName<double>((SPxLPBase<double> *)
                                       (this->super_LPColSetBase<double>).super_SVSetBase<double>.
                                       set.thekey,iVar19,p_cnames,local_98);
          dVar24 = (this->super_LPColSetBase<double>).up.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar20];
          pcVar9 = "UP";
          goto LAB_001b1a1f;
        }
      }
      else {
        pcVar11 = getColName<double>((SPxLPBase<double> *)
                                     (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                     thekey,iVar19,p_cnames,local_98);
        dVar24 = (this->super_LPColSetBase<double>).low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar20];
        pcVar9 = "FX";
LAB_001b1a1f:
        MPSwriteRecord<double>(p_output,pcVar9,"BOUND",pcVar11,dVar24,(char *)0x0,0.0);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"ENDATA",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  if (((this->thesense == MAXIMIZE) && (pSVar4 = this->spxout, pSVar4 != (SPxOut *)0x0)) &&
     (0 < (int)pSVar4->m_verbosity)) {
    local_68 = (undefined1 *)CONCAT44(local_68._4_4_,pSVar4->m_verbosity);
    local_6c = 1;
    (*pSVar4->_vptr_SPxOut[2])();
    std::__ostream_insert<char,std::char_traits<char>>
              (this->spxout->m_streams[this->spxout->m_verbosity],
               "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n"
               ,99);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_68);
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::writeMPS(
   std::ostream&  p_output,          ///< output stream.
   const NameSet* p_rnames,          ///< row names.
   const NameSet* p_cnames,          ///< column names.
   const DIdxSet* p_intvars,         ///< integer variables.
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{

   const char*    indicator;
   char           name [16];
   char           name1[16];
   char           name2[16];
   bool           has_ranges = false;
   int            i;
   int            k;

   SPxOut::setScientific(p_output, 16);
   // --- NAME Section ---
   p_output << "NAME          MPSDATA" << std::endl;

   // --- ROWS Section ---
   p_output << "ROWS" << std::endl;

   for(i = 0; i < nRows(); i++)
   {
      if(lhs(i) == rhs(i))
         indicator = "E";
      else if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
      {
         indicator = "E";
         has_ranges = true;
      }
      else if(lhs(i) > R(-infinity))
         indicator = "G";
      else if(rhs(i) <  R(infinity))
         indicator = "L";
      else
         throw SPxInternalCodeException("XMPSWR02 This should never happen.");

      MPSwriteRecord<R>(p_output, indicator, MPSgetRowName(*this, i, p_rnames, name));
   }

   MPSwriteRecord<R>(p_output, "N", "MINIMIZE");

   // --- COLUMNS Section ---
   p_output << "COLUMNS" << std::endl;

   bool has_intvars = (p_intvars != nullptr) && (p_intvars->size() > 0);

   for(int j = 0; j < (has_intvars ? 2 : 1); j++)
   {
      bool is_intrun = has_intvars && (j == 1);

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTORG'" << std::endl;

      for(i = 0; i < nCols(); i++)
      {
         bool is_intvar = has_intvars && (p_intvars->pos(i) >= 0);

         if((is_intrun && !is_intvar) || (!is_intrun &&  is_intvar))
            continue;

         const SVectorBase<R>& col = colVector(i);
         int colsize2 = (col.size() / 2) * 2;

         assert(colsize2 % 2 == 0);

         for(k = 0; k < colsize2; k += 2)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k),
                           MPSgetRowName(*this, col.index(k + 1), p_rnames, name2), col.value(k + 1));

         if(colsize2 != col.size())
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k));

         if(isNotZero(maxObj(i), this->tolerances()->epsilon()) || writeZeroObjective)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name), "MINIMIZE", -maxObj(i));
      }

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTEND'" << std::endl;
   }

   // --- RHS Section ---
   p_output << "RHS" << std::endl;

   i = 0;

   while(i < nRows())
   {
      R rhsval1 = 0.0;
      R rhsval2 = 0.0;

      for(; i < nRows(); i++)
         if((rhsval1 = MPSgetRHS(lhs(i), rhs(i))) != 0.0)
            break;

      if(i < nRows())
      {
         for(k = i + 1; k < nRows(); k++)
         {
            if((rhsval2 = MPSgetRHS(lhs(k), rhs(k))) != 0.0)
               break;
         }

         if(k < nRows())
         {
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1,
                           MPSgetRowName(*this, k, p_rnames, name2), rhsval2);
         }
         else
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1);

         i = k + 1;
      }
   }

   // --- RANGES Section ---
   if(has_ranges)
   {
      p_output << "RANGES" << std::endl;

      for(i = 0; i < nRows(); i++)
      {
         if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
            MPSwriteRecord(p_output, "", "RANGE", MPSgetRowName(*this, i, p_rnames, name1), rhs(i) - lhs(i));
      }
   }

   // --- BOUNDS Section ---
   p_output << "BOUNDS" << std::endl;

   for(i = 0; i < nCols(); i++)
   {
      if(lower(i) == upper(i))
      {
         MPSwriteRecord(p_output, "FX", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         continue;
      }

      if((lower(i) <= R(-infinity)) && (upper(i) >= R(infinity)))
      {
         MPSwriteRecord<R>(p_output, "FR", "BOUND", getColName(*this, i, p_cnames, name1));
         continue;
      }

      if(lower(i) != 0.0)
      {
         if(lower(i) > R(-infinity))
            MPSwriteRecord(p_output, "LO", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         else
            MPSwriteRecord<R>(p_output, "MI", "BOUND", getColName(*this, i, p_cnames, name1));
      }

      if(has_intvars && (p_intvars->pos(i) >= 0))
      {
         // Integer variables have default upper bound 1.0, but we should write
         // it nevertheless since CPLEX seems to assume R(infinity) otherwise.
         MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
      else
      {
         // Continous variables have default upper bound R(infinity)
         if(upper(i) < R(infinity))
            MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
   }

   // --- ENDATA Section ---
   p_output << "ENDATA" << std::endl;

   // Output warning when writing a maximisation problem
   if(spxSense() == SPxLPBase<R>::MAXIMIZE)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n");
   }
}